

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

SBuf * lj_buf_putstr_rep(SBuf *sb,GCstr *s,int32_t rep)

{
  uint uVar1;
  uint64_t uVar2;
  uint sz;
  GCstr *pGVar3;
  char *pcVar4;
  GCstr *local_60;
  char *q;
  char *e;
  char *pcStack_48;
  uint32_t c;
  char *w;
  uint64_t tlen;
  MSize len;
  int32_t rep_local;
  GCstr *s_local;
  SBuf *sb_local;
  char *local_10;
  
  uVar1 = s->len;
  if ((0 < rep) && (uVar1 != 0)) {
    if (0x7fffff00 < (long)rep * (ulong)uVar1) {
      lj_err_mem((lua_State *)((sb->L).ptr64 & 0xfffffffffffffff8));
    }
    sz = (uint)((long)rep * (ulong)uVar1);
    if ((uint)((int)sb->e - (int)sb->w) < sz) {
      local_10 = lj_buf_more2(sb,sz);
    }
    else {
      local_10 = sb->w;
    }
    pcStack_48 = local_10;
    tlen._4_4_ = rep;
    if (uVar1 == 1) {
      uVar2 = s[1].nextgc.gcptr64;
      do {
        pcVar4 = pcStack_48 + 1;
        *pcStack_48 = (char)uVar2;
        tlen._4_4_ = tlen._4_4_ + -1;
        pcStack_48 = pcVar4;
      } while (0 < tlen._4_4_);
    }
    else {
      do {
        local_60 = s + 1;
        do {
          pGVar3 = (GCstr *)((long)&(local_60->nextgc).gcptr64 + 1);
          pcVar4 = pcStack_48 + 1;
          *pcStack_48 = (char)(local_60->nextgc).gcptr64;
          local_60 = pGVar3;
          pcStack_48 = pcVar4;
        } while (pGVar3 < (GCstr *)((long)&s[1].nextgc.gcptr64 + (ulong)uVar1));
        tlen._4_4_ = tlen._4_4_ + -1;
      } while (0 < tlen._4_4_);
    }
    sb->w = pcStack_48;
  }
  return sb;
}

Assistant:

SBuf *lj_buf_putstr_rep(SBuf *sb, GCstr *s, int32_t rep)
{
  MSize len = s->len;
  if (rep > 0 && len) {
    uint64_t tlen = (uint64_t)rep * len;
    char *w;
    if (LJ_UNLIKELY(tlen > LJ_MAX_STR))
      lj_err_mem(sbufL(sb));
    w = lj_buf_more(sb, (MSize)tlen);
    if (len == 1) {  /* Optimize a common case. */
      uint32_t c = strdata(s)[0];
      do { *w++ = c; } while (--rep > 0);
    } else {
      const char *e = strdata(s) + len;
      do {
	const char *q = strdata(s);
	do { *w++ = *q++; } while (q < e);
      } while (--rep > 0);
    }
    sb->w = w;
  }
  return sb;
}